

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

void __thiscall
BayesianGameWithClusterInfo::ShiftProbabilityAndUtility
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  BayesianGameIdenticalPayoff *this_00;
  undefined1 auVar1 [16];
  RewardModelDiscreteInterface *pRVar2;
  bool bVar3;
  int iVar4;
  Index i;
  Index i_00;
  undefined4 extraout_var;
  reference pvVar5;
  size_t sVar6;
  Index jaI;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  allocator_type local_a9;
  double local_a8;
  double local_a0;
  value_type local_98;
  value_type local_94;
  size_type local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  double local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  double local_58;
  value_type_conflict1 local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  auVar10 = ZEXT864(0) << 0x40;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_94 = t2;
  iVar4 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
  local_4c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             CONCAT44(extraout_var,iVar4),&local_4c,&local_a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  local_60 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  local_98 = t1;
  local_90 = (ulong)agI;
  do {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,local_90);
    dVar8 = auVar10._0_8_;
    if (*pvVar5 == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,local_90)
      ;
      *pvVar5 = local_94;
      i = BayesianGameBase::IndividualToJointTypeIndices
                    ((BayesianGameBase *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
      i_00 = BayesianGameBase::IndividualToJointTypeIndices
                       ((BayesianGameBase *)this_00,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)i);
      local_a0 = dVar8;
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)i_00);
      local_68 = dVar8 + local_a0;
      local_a8 = dVar8;
      BayesianGameBase::SetProbability((BayesianGameBase *)this_00,i,local_68);
      auVar10 = ZEXT864(0) << 0x40;
      BayesianGameBase::SetProbability((BayesianGameBase *)this_00,i_00,0.0);
      if (this->_m_clusterAlgorithm != Lossless) {
        uVar7 = 0;
        local_58 = local_a0 / local_68;
        local_a8 = local_a8 / local_68;
        auVar10 = ZEXT864((ulong)local_a8);
        while( true ) {
          sVar6 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)this_00);
          dVar8 = auVar10._0_8_;
          if (sVar6 <= uVar7) break;
          (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this_00,(ulong)i,uVar7);
          local_a0 = dVar8;
          (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this_00,(ulong)i_00,uVar7);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_a0;
          pRVar2 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                   _m_utilFunction;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_58;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar8 * local_a8;
          auVar1 = vfmadd132sd_fma(auVar9,auVar11,auVar1);
          auVar10 = ZEXT1664(auVar1);
          (*(pRVar2->super_QTableInterface)._vptr_QTableInterface[1])(pRVar2,(ulong)i,uVar7);
          uVar7 = (ulong)((int)uVar7 + 1);
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      t1 = local_98;
    }
    bVar3 = IndexTools::Increment
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,local_60);
  } while (!bVar3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void BayesianGameWithClusterInfo::ShiftProbabilityAndUtility(Index agI, Index t1, Index t2)
{
    

    //add the probability mass of the joint types in which
    //t2 participates to the corresponding joint types
    //of t1.
    vector<Index> typeIndices;
    //first we compute the marginals P(t1) and P(t2)
    double p1, p2 = 0.0;
    double u1, u2 = 0;
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( 
                    typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( 
                    typeIndices2);
            p1 = GetProbability(jtI1);
            p2 = GetProbability(jtI2);

            SetProbability(jtI1, p1+p2);
            SetProbability(jtI2, 0.0);

            // if are doing approximate clustering, also update the
            // utility by a weighted sum
            if(_m_clusterAlgorithm!=Lossless)
            {
                for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
                {
                    u1 = GetUtility(jtI1,jaI);
                    u2 = GetUtility(jtI2,jaI);

                    // set the weighted utility
                    SetUtility(jtI1, jaI, (p1/(p1+p2))*u1 + (p2/(p1+p2))*u2);
                }
            }
        }        
        finished = 
            IndexTools::Increment(typeIndices, _m_nrTypes);
    }
}